

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffrsim(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  uint uVar1;
  LONGLONG tnaxes [99];
  LONGLONG aLStack_338 [99];
  
  if (0 < *status) {
    return *status;
  }
  if (0 < naxis) {
    uVar1 = 0x62;
    if (naxis - 1U < 0x62) {
      uVar1 = naxis - 1U;
    }
    memcpy(aLStack_338,naxes,(ulong)(uVar1 * 8 + 8));
  }
  ffrsimll(fptr,bitpix,naxis,aLStack_338,status);
  return *status;
}

Assistant:

int ffrsim(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    LONGLONG tnaxes[99];
    int ii;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; (ii < naxis) && (ii < 99); ii++)
        tnaxes[ii] = naxes[ii];

    ffrsimll(fptr, bitpix, naxis, tnaxes, status);

    return(*status);
}